

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void __thiscall obx::Store::Store(Store *this,OBX_store *ptr,bool owned)

{
  __pointer_type pOVar1;
  bool owned_local;
  OBX_store *ptr_local;
  Store *this_local;
  
  this->_vptr_Store = (_func_int **)&PTR__Store_001257a8;
  std::atomic<OBX_store_*>::atomic(&this->cStore_,ptr);
  this->owned_ = owned;
  std::shared_ptr<obx::Closable>::shared_ptr(&this->syncClient_);
  std::mutex::mutex(&this->syncClientMutex_);
  pOVar1 = std::atomic::operator_cast_to_OBX_store_((atomic *)&this->cStore_);
  if (pOVar1 != (__pointer_type)0x0) {
    return;
  }
  internal::throwIllegalArgumentException("Argument validation failed: ","cStore_ != nullptr");
}

Assistant:

explicit Store(OBX_store* ptr, bool owned) : cStore_(ptr), owned_(owned) {
        OBX_VERIFY_ARGUMENT(cStore_ != nullptr);
    }